

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int WriteToFile(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  int prn;
  int in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000058;
  double in_stack_00000060;
  double in_stack_00000068;
  double in_stack_00000070;
  double in_stack_00000978;
  double in_stack_00000980;
  double in_stack_00000988;
  int in_stack_00000990;
  int in_stack_00000994;
  double in_stack_000012a8;
  double in_stack_000012b0;
  double in_stack_000012b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string fix;
  ofstream out;
  undefined8 auStack_430 [2];
  uint auStack_420 [2];
  byte abStack_418 [480];
  ifstream in;
  uint auStack_218 [122];
  
  std::ifstream::ifstream(&in);
  std::__cxx11::string::string((string *)&fix,"result.txt",(allocator *)&out);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,param_1,
                 &fix);
  std::ifstream::open((string *)&in,(_Ios_Openmode)&out);
  std::__cxx11::string::~string((string *)&out);
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(_in + -0x18));
  std::ifstream::close();
  std::ofstream::ofstream(&out);
  std::operator+(&local_478,param_1,&fix);
  std::ofstream::open((string *)&out,(_Ios_Openmode)&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  lVar5 = *(long *)(_out + -0x18);
  if ((abStack_418[lVar5] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"error happened when writing file");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ofstream::~ofstream(&out);
    std::__cxx11::string::~string((string *)&fix);
    std::ifstream::~ifstream(&in);
    return 1;
  }
  if ((uVar2 & 7) != 0) {
    std::operator<<((ostream *)&out,
                    "Week      SOW         ECEF/X-m      ECEF/Y-m      ECEF/Z-m     ");
    std::operator<<((ostream *)&out,"REF-ECEF/X-m  REF-ECEF/Y-m    ECEF/Z-m      ");
    poVar4 = std::operator<<((ostream *)&out,
                             "EAST/m  NORTH/m  UP/m    B/deg     L/deg     H/m      VX-m/s  VY-m/s  VZ-m/s     PDOP  Sigma-m  Sigma-m/s    BDSObsNum     GPSObsNum"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar5 = *(long *)(_out + -0x18);
  }
  iVar3 = in_stack_00000008;
  *(uint *)((long)auStack_420 + lVar5) = *(uint *)((long)auStack_420 + lVar5) & 0xfffffefb | 4;
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18)) = 4;
  poVar4 = (ostream *)std::ostream::operator<<(&out,in_stack_00000008);
  std::operator<<(poVar4,"  ");
  dVar1 = in_stack_00000010;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000010);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000018);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000020);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000028);
  std::operator<<(poVar4,"  ");
  if ((in_stack_00000048 != -1.0) || (NAN(in_stack_00000048))) {
    poVar4 = std::ostream::_M_insert<double>(in_stack_00000048);
    std::operator<<(poVar4,"  ");
    poVar4 = std::ostream::_M_insert<double>(in_stack_00000050);
    std::operator<<(poVar4,"  ");
    poVar4 = std::ostream::_M_insert<double>(in_stack_00000058);
    std::operator<<(poVar4,"  ");
  }
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000978);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000980);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000988);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000030);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000038);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000040);
  std::operator<<(poVar4,"  ");
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000060);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000068);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_00000070);
  std::operator<<(poVar4,"  ");
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_000012b8);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_000012a8);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<double>(in_stack_000012b0);
  std::operator<<(poVar4,"  ");
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 10;
  poVar4 = (ostream *)std::ostream::operator<<(&out,in_stack_00000994);
  poVar4 = std::operator<<(poVar4,"  ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_stack_00000990);
  std::operator<<(poVar4,"       ");
  lVar6 = 0x80;
  for (lVar5 = 0x154; lVar5 != 0x194; lVar5 = lVar5 + 1) {
    if (((*(double *)(&stack0x00000008 + lVar5 * 2) != 0.0) ||
        (NAN(*(double *)(&stack0x00000008 + lVar5 * 2)))) &&
       ((*(double *)((long)&stack0x00000008 + lVar6) != -1.0 ||
        (NAN(*(double *)((long)&stack0x00000008 + lVar6)))))) {
      poVar4 = std::operator<<((ostream *)&out,"C");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
      poVar4 = std::operator<<(poVar4,0x30);
      std::ostream::operator<<(poVar4,(int)lVar5 + -0x153);
    }
    lVar6 = lVar6 + 0x18;
  }
  lVar6 = 0x680;
  for (lVar5 = 0x134; lVar5 != 0x154; lVar5 = lVar5 + 1) {
    if (((*(double *)(&stack0x00000008 + lVar5 * 2) != 0.0) ||
        (NAN(*(double *)(&stack0x00000008 + lVar5 * 2)))) &&
       ((*(double *)((long)&stack0x00000008 + lVar6) != -1.0 ||
        (NAN(*(double *)((long)&stack0x00000008 + lVar6)))))) {
      poVar4 = std::operator<<((ostream *)&out,"G");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
      poVar4 = std::operator<<(poVar4,0x30);
      std::ostream::operator<<(poVar4,(int)lVar5 + -0x133);
    }
    lVar6 = lVar6 + 0x18;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&out);
  std::ofstream::close();
  std::__cxx11::string::assign((char *)&fix);
  std::operator+(&local_478,param_1,&fix);
  std::ofstream::open((string *)&out,(_Ios_Openmode)&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) =
       *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18)) = 4;
  poVar4 = (ostream *)std::ostream::operator<<(&out,iVar3);
  std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar4,"  ");
  *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 3;
  poVar4 = (ostream *)std::ostream::operator<<(&out,in_stack_00000994);
  poVar4 = std::operator<<(poVar4,"  ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_stack_00000990);
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar6 = 0x80;
  for (lVar5 = 0x154; lVar5 != 0x194; lVar5 = lVar5 + 1) {
    if ((*(double *)(&stack0x00000008 + lVar5 * 2) != 0.0) ||
       (NAN(*(double *)(&stack0x00000008 + lVar5 * 2)))) {
      dVar1 = *(double *)((long)&stack0x00000008 + lVar6);
      if ((dVar1 != -1.0) || (NAN(dVar1))) {
        poVar4 = std::operator<<((ostream *)&out,"C");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
        poVar4 = std::operator<<(poVar4,0x30);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar5 + -0x153);
        std::operator<<(poVar4," ");
        std::operator<<((ostream *)&out,0x20);
        *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18)) = 4;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0xfffffffffffffff8 + lVar6));
        poVar4 = std::operator<<(poVar4,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000000 + lVar6));
        poVar4 = std::operator<<(poVar4,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(dVar1);
        std::operator<<(poVar4,"  ");
        *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18)) = 10;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000608 + lVar5 * 8));
        poVar4 = std::operator<<(poVar4,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000308 + lVar5 * 8));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    lVar6 = lVar6 + 0x18;
  }
  lVar5 = 0xd0;
  lVar6 = 0;
  do {
    if ((*(double *)(&stack0x000009a8 + lVar6 * 8) != 0.0) ||
       (NAN(*(double *)(&stack0x000009a8 + lVar6 * 8)))) {
      dVar1 = *(double *)(&stack0x00000008 + lVar5 * 2);
      if ((dVar1 != -1.0) || (NAN(dVar1))) {
        poVar4 = std::operator<<((ostream *)&out,"G");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
        poVar4 = std::operator<<(poVar4,0x30);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar6 + 1);
        std::operator<<(poVar4," ");
        std::operator<<((ostream *)&out,0x20);
        *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18)) = 4;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0xfffffffffffffff8 + lVar5 * 8));
        poVar4 = std::operator<<(poVar4,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000000 + lVar5 * 8));
        poVar4 = std::operator<<(poVar4,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(dVar1);
        std::operator<<(poVar4,"  ");
        *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)(_out + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18)) = 10;
        *(undefined8 *)((long)auStack_430 + *(long *)(_out + -0x18) + 8) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000fa8 + lVar6 * 8));
        poVar4 = std::operator<<(poVar4,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
        poVar4 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000ca8 + lVar6 * 8));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 3;
  } while( true );
}

Assistant:

int WriteToFile(SPPResult result, string path){
    ifstream in;
    string fix = "result.txt";
    in.open(path + fix);
    bool isdata = false;
    if(in.eof() || !in)
        isdata = true;
    in.close();

    ofstream out;
    out.open(path + fix, ios::app);
    if(!out){
        cout << "error happened when writing file" << endl;
        return 1;
    }
    out.right;
    if(isdata) {
        out << "Week      SOW         ECEF/X-m      ECEF/Y-m      ECEF/Z-m     ";
        out << "REF-ECEF/X-m  REF-ECEF/Y-m    ECEF/Z-m      ";
        out << "EAST/m  NORTH/m  UP/m    B/deg     L/deg     H/m      VX-m/s  VY-m/s  VZ-m/s     PDOP  Sigma-m  Sigma-m/s    BDSObsNum     GPSObsNum" << endl;
    }

    out << fixed << setprecision(4);
    out << result.ObsTime.Week << "  " << result.ObsTime.SOW << "  ";
    out << result.UserPositionXYZ.X << "  " << result.UserPositionXYZ.Y << "  " << result.UserPositionXYZ.Z << "  ";
    if(result.UserRefPositionXYZ.X != -1)
        out << result.UserRefPositionXYZ.X << "  " << result.UserRefPositionXYZ.Y << "  " << result.UserRefPositionXYZ.Z << "  ";
    out << setw(8) << result.diffNeu.X << setw(8) << result.diffNeu.Y << setw(8) << result.diffNeu.Z << "  ";
    out << result.UserPositionBLH.B << "  " << result.UserPositionBLH.L << "  " << result.UserPositionBLH.H << "  ";
    out << setw(8) << result.UserVelocity.X << setw(8) << result.UserVelocity.Y << setw(8) << result.UserVelocity.Z << "  ";
    out << setw(8) << result.PDop << setw(8) << result.UserPositionSigma << setw(8) << result.UserVelocitySigma << "  ";
    out << setw(10) << result.BDSObsNum << "  " << setw(10) << result.GPSObsNum << "       ";
    for(int prn = 0; prn < MAXBDSSRN; ++ prn) {
        if(result.BDSDist[prn] != 0 && result.BDSPosi[prn].Z != -1)
            out << "C" << setw(2) << setfill('0') << prn + 1;
    }
    for(int prn = 0; prn < MAXGPSSRN; ++ prn) {
        if(result.GPSDist[prn] != 0 && result.GPSPosi[prn].Z != -1)
            out << "G" << setw(2) << setfill('0') << prn + 1;
    }
    out << endl;
    out.close();

    fix = "sat.txt";
    out.open(path + fix, ios::app);
    out.right;
    out << fixed << setprecision(4);
    out << result.ObsTime.Week << "  " << result.ObsTime.SOW << "  ";
    out << setw(3) << result.BDSObsNum << "  " << setw(3) << result.GPSObsNum << endl;
    for(int prn = 0; prn < MAXBDSSRN; ++ prn) {
        if(result.BDSDist[prn] != 0 && result.BDSPosi[prn].Z != -1) {
            out << "C" << setw(2) << setfill('0') << prn + 1 << " ";
            out << setfill(' ');
            out << fixed << setprecision(4);
            out << setw(15) << result.BDSPosi[prn].X << "  " << setw(15) << result.BDSPosi[prn].Y << "  " << setw(15) << result.BDSPosi[prn].Z << "  ";
            out << fixed << setprecision(10);
            out << setw(15) << result.BDSAzimuth[prn] << "  " << setw(15) << result.BDSelev[prn] << endl;
        }
    }
    for(int prn = 0; prn < MAXGPSSRN; ++ prn) {
        if(result.GPSDist[prn] != 0 && result.GPSPosi[prn].Z != -1) {
            out << "G" << setw(2) << setfill('0') << prn + 1 << " ";
            out << setfill(' ');
            out << fixed << setprecision(4);
            out << setw(15) << result.GPSPosi[prn].X << "  " << setw(15) << result.GPSPosi[prn].Y << "  " << setw(15) << result.GPSPosi[prn].Z << "  ";
            out << fixed << setprecision(10);
            out << setw(15) << result.GPSAzimuth[prn] << "  " << setw(15) << result.GPSelev[prn] << endl;
        }
    }
}